

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::ChimpGroupState<unsigned_long>::LoadFlags
          (ChimpGroupState<unsigned_long> *this,uint8_t *packed_data,idx_t group_size)

{
  Flags FVar1;
  idx_t i;
  idx_t iVar2;
  FlagBuffer<false> local_30;
  
  local_30.counter = 0;
  this->flags[0] = VALUE_IDENTICAL;
  local_30.buffer = packed_data;
  for (iVar2 = 0; group_size != iVar2; iVar2 = iVar2 + 1) {
    FVar1 = FlagBuffer<false>::Extract(&local_30);
    this->flags[iVar2 + 1] = FVar1;
  }
  this->max_flags_to_read = group_size;
  this->index = 0;
  return;
}

Assistant:

void LoadFlags(uint8_t *packed_data, idx_t group_size) {
		FlagBuffer<false> flag_buffer;
		flag_buffer.SetBuffer(packed_data);
		flags[0] = ChimpConstants::Flags::VALUE_IDENTICAL; // First value doesn't require a flag
		for (idx_t i = 0; i < group_size; i++) {
			flags[1 + i] = (ChimpConstants::Flags)flag_buffer.Extract();
		}
		max_flags_to_read = group_size;
		index = 0;
	}